

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate.c
# Opt level: O0

void dsRunLogCallback(char *fmt,...)

{
  char in_AL;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_e8 [8];
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  void *local_38;
  void *userPtr;
  dsLogCallback callback;
  va_list ap;
  char *fmt_local;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  if (logCallback != (dsLogCallback)0x0) {
    local_e0 = in_RSI;
    local_d8 = in_RDX;
    local_d0 = in_RCX;
    local_c8 = in_R8;
    local_c0 = in_R9;
    ap[0].reg_save_area = fmt;
    pthread_rwlock_rdlock((pthread_rwlock_t *)&logLock);
    userPtr = logCallback;
    local_38 = logUserPtr;
    pthread_rwlock_unlock((pthread_rwlock_t *)&logLock);
    ap[0].overflow_arg_area = local_e8;
    ap[0]._0_8_ = &stack0x00000008;
    callback._4_4_ = 0x30;
    callback._0_4_ = 8;
    (*(code *)userPtr)(local_38,ap[0].reg_save_area,&callback);
  }
  return;
}

Assistant:

void
dsRunLogCallback(const char *fmt, ...)
{
	va_list ap;
	dsLogCallback callback;
	void *userPtr;

	if (logCallback == NULL) {
		return;
	}

	pthread_rwlock_rdlock(&logLock);
	callback = logCallback;
	userPtr = logUserPtr;
	pthread_rwlock_unlock(&logLock);

	va_start(ap, fmt);
	callback(userPtr, fmt, ap);
	va_end(ap);
}